

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int jas_stream_write(jas_stream_t *stream,void *buf,uint cnt)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  byte *pbStack_30;
  uint n;
  char *bufptr;
  uint cnt_local;
  void *buf_local;
  jas_stream_t *stream_local;
  
  iVar3 = jas_getdbglevel();
  if (99 < iVar3) {
    jas_eprintf("jas_stream_write(%p, %p, %d)\n",stream,buf,(ulong)cnt);
  }
  local_34 = 0;
  pbStack_30 = (byte *)buf;
  while( true ) {
    if (cnt <= local_34) {
      return local_34;
    }
    if ((stream->flags_ & 7U) == 0) {
      if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
        stream->bufmode_ = stream->bufmode_ | 0x20;
        iVar3 = stream->cnt_ + -1;
        stream->cnt_ = iVar3;
        if (iVar3 < 0) {
          local_3c = jas_stream_flushbuf(stream,(uint)*pbStack_30);
        }
        else {
          stream->rwcnt_ = stream->rwcnt_ + 1;
          bVar1 = *pbStack_30;
          pbVar2 = stream->ptr_;
          stream->ptr_ = pbVar2 + 1;
          *pbVar2 = bVar1;
          local_3c = (uint)bVar1;
        }
        local_38 = local_3c;
      }
      else {
        stream->flags_ = stream->flags_ | 4;
        local_38 = 0xffffffff;
      }
      local_40 = local_38;
    }
    else {
      local_40 = 0xffffffff;
    }
    if (local_40 == 0xffffffff) break;
    pbStack_30 = pbStack_30 + 1;
    local_34 = local_34 + 1;
  }
  return local_34;
}

Assistant:

int jas_stream_write(jas_stream_t *stream, const void *buf, unsigned cnt)
{
	const char *bufptr;

	JAS_DBGLOG(100, ("jas_stream_write(%p, %p, %d)\n", stream, buf, cnt));

	bufptr = buf;

	unsigned n = 0;
	while (n < cnt) {
		if (jas_stream_putc(stream, *bufptr) == EOF) {
			return n;
		}
		++bufptr;
		++n;
	}

	return n;
}